

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void lua_createtable(lua_State *L,int narray,int nrec)

{
  TValue *pTVar1;
  GCtab *pGVar2;
  int nrec_local;
  int narray_local;
  lua_State *L_local;
  
  if (*(ulong *)((L->glref).ptr64 + 0x18) <= *(ulong *)((L->glref).ptr64 + 0x10)) {
    lj_gc_step(L);
  }
  pTVar1 = L->top;
  pGVar2 = lj_tab_new_ah(L,narray,nrec);
  pTVar1->u64 = (ulong)pGVar2 | 0xfffa000000000000;
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  if ((TValue *)(L->maxstack).ptr64 <= pTVar1 + 1) {
    lj_state_growstack1(L);
  }
  return;
}

Assistant:

LUA_API void lua_createtable(lua_State *L, int narray, int nrec)
{
  lj_gc_check(L);
  settabV(L, L->top, lj_tab_new_ah(L, narray, nrec));
  incr_top(L);
}